

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O2

Matrix3x3 * __thiscall
CGL::Matrix3x3::operator*(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this,Matrix3x3 *B)

{
  int i;
  long lVar1;
  Vector3D *pVVar2;
  long lVar3;
  Vector3D *pVVar4;
  int k;
  long lVar5;
  double dVar6;
  
  Matrix3x3(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    lVar3 = 0;
    pVVar2 = B->entries;
    for (; lVar3 != 3; lVar3 = lVar3 + 1) {
      dVar6 = 0.0;
      lVar5 = 0;
      pVVar4 = this->entries;
      for (; lVar5 != 3; lVar5 = lVar5 + 1) {
        dVar6 = dVar6 + ((Vector3D *)&pVVar4->x)->x * (&((Vector3D *)&pVVar2->x)->x)[lVar5];
        pVVar4 = pVVar4 + 1;
      }
      (&__return_storage_ptr__->entries[lVar3].x)[lVar1] = dVar6;
      pVVar2 = pVVar2 + 1;
    }
    this = (Matrix3x3 *)&this->entries[0].y;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::operator*( const Matrix3x3& B ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 C;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       C(i,j) = 0.;

       for( int k = 0; k < 3; k++ )
       {
          C(i,j) += A(i,k)*B(k,j);
       }
    }

    return C;
  }